

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

void __thiscall sqlite::Database::Database(Database *this,string *path)

{
  sqlite3 *__p;
  anon_class_32_1_89901123 aStack_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::__cxx11::string::string((string *)&aStack_58,(string *)path);
  __p = Database::anon_class_32_1_89901123::operator()(&aStack_58);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(sqlite3_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dkolmakov[P]hm/src/././database.hpp:52:13)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(sqlite3_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dkolmakov[P]hm/src/././database.hpp:52:13)>
             ::_M_manager;
  std::__uniq_ptr_impl<sqlite3,std::function<void(sqlite3*)>>::
  __uniq_ptr_impl<std::function<void(sqlite3*)>>
            ((__uniq_ptr_impl<sqlite3,std::function<void(sqlite3*)>> *)this,__p,
             (function<void_(sqlite3_*)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::__cxx11::string::~string((string *)&aStack_58);
  return;
}

Assistant:

explicit Database(const std::string path)
      : db(
            [path]() {
              sqlite3* _db;
              int rc = sqlite3_open(path.c_str(), &_db);

              if (rc != SQLITE_OK) {
                throw SqliteException(
                    "can't open database: " + std::string(sqlite3_errmsg(_db)),
                    rc);
              }

              return _db;
            }(),
            [](sqlite3* _db) { sqlite3_close(_db); }) {}